

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtins.cpp
# Opt level: O3

void LoadBuiltins(Sexp *activation)

{
  ContractFrameProtector local_30;
  ContractFrameProtector __contract_frame;
  FrameProtector __frame_prot;
  Sexp *activation_local;
  
  __frame_prot.protected_frame = (Frame *)activation;
  ContractFrameProtector::ContractFrameProtector(&local_30,"LoadBuiltins");
  ContractFrame::CheckPrecondition
            (local_30.protected_frame,activation->kind == ACTIVATION,"activation->IsActivation()");
  FrameProtector::FrameProtector((FrameProtector *)&__contract_frame,"LoadBuiltins");
  FrameProtector::ProtectValue
            ((FrameProtector *)&__contract_frame,(Sexp **)&__frame_prot,"activation");
  LoadSingleBuiltin<Sexp*(*)(Sexp*,Sexp*)>
            ((Sexp *)__frame_prot.protected_frame,"-primitive-add",Builtin_Add);
  LoadSingleBuiltin<Sexp*(*)(Sexp*,Sexp*)>
            ((Sexp *)__frame_prot.protected_frame,"-primitive-sub",Builtin_Sub);
  LoadSingleBuiltin<Sexp*(*)(Sexp*,Sexp*)>
            ((Sexp *)__frame_prot.protected_frame,"-primitive-mul",Builtin_Mul);
  LoadSingleBuiltin<Sexp*(*)(Sexp*,Sexp*)>
            ((Sexp *)__frame_prot.protected_frame,"-primitive-div",Builtin_Div);
  LoadSingleBuiltin<Sexp*(*)(Sexp*)>((Sexp *)__frame_prot.protected_frame,"car",Builtin_Car);
  LoadSingleBuiltin<Sexp*(*)(Sexp*)>((Sexp *)__frame_prot.protected_frame,"cdr",Builtin_Cdr);
  LoadSingleBuiltin<Sexp*(*)(Sexp*,Sexp*)>((Sexp *)__frame_prot.protected_frame,"cons",Builtin_Cons)
  ;
  LoadSingleBuiltin<Sexp*(*)()>((Sexp *)__frame_prot.protected_frame,"read",Builtin_Read);
  LoadSingleBuiltin<Sexp*(*)(Sexp*)>((Sexp *)__frame_prot.protected_frame,"eval",Builtin_Eval);
  LoadSingleBuiltin<Sexp*(*)(Sexp*)>((Sexp *)__frame_prot.protected_frame,"print",Builtin_Print);
  LoadSingleBuiltin<Sexp*(*)(Sexp*)>((Sexp *)__frame_prot.protected_frame,"println",Builtin_Println)
  ;
  LoadSingleBuiltin<Sexp*(*)(Sexp*)>((Sexp *)__frame_prot.protected_frame,"error",Builtin_Error);
  LoadSingleBuiltin<Sexp*(*)(Sexp*)>
            ((Sexp *)__frame_prot.protected_frame,"eof-object?",Builtin_EofObject_P);
  LoadSingleBuiltin<Sexp*(*)(Sexp*)>((Sexp *)__frame_prot.protected_frame,"empty?",Builtin_EmptyP);
  LoadSingleBuiltin<Sexp*(*)(Sexp*)>((Sexp *)__frame_prot.protected_frame,"not",Builtin_Not);
  LoadSingleBuiltin<Sexp*(*)(Sexp*)>((Sexp *)__frame_prot.protected_frame,"pair?",Builtin_PairP);
  LoadSingleBuiltin<Sexp*(*)(Sexp*,Sexp*)>((Sexp *)__frame_prot.protected_frame,"eq?",Builtin_EqP);
  LoadSingleBuiltin<Sexp*(*)(Sexp*,Sexp*)>
            ((Sexp *)__frame_prot.protected_frame,"equal?",Builtin_EqualP);
  LoadSingleBuiltin<Sexp*(*)(Sexp*,Sexp*)>
            ((Sexp *)__frame_prot.protected_frame,"set-car!",Builtin_SetCar);
  LoadSingleBuiltin<Sexp*(*)(Sexp*,Sexp*)>
            ((Sexp *)__frame_prot.protected_frame,"set-cdr!",Builtin_SetCdr);
  FrameProtector::~FrameProtector((FrameProtector *)&__contract_frame);
  ContractFrameProtector::~ContractFrameProtector(&local_30);
  return;
}

Assistant:

void LoadBuiltins(Sexp *activation) {
  CONTRACT { PRECONDITION(activation->IsActivation()); }